

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MomAngMomCorrFunc.cpp
# Opt level: O2

int __thiscall
OpenMD::MomAngMomCorrFunc::computeProperty1(MomAngMomCorrFunc *this,int frame,StuntDouble *sd)

{
  double s;
  pointer pvVar1;
  Vector<double,_3U> local_70;
  Vector<double,_3U> local_58;
  Vector<double,_3U> local_40;
  
  pvVar1 = (this->momenta_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  s = sd->mass_;
  StuntDouble::getVel((Vector3d *)&local_70,sd);
  operator*(&local_58,s,&local_70);
  Vector<double,_3U>::Vector(&local_40,&local_58);
  std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
  emplace_back<OpenMD::Vector3<double>>
            ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
             (pvVar1 + frame),(Vector3<double> *)&local_40);
  pvVar1 = (this->momenta_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)(((long)*(pointer *)
                       ((long)&pvVar1[frame].
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar1[frame].
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data) / 0x18) + -1;
}

Assistant:

int MomAngMomCorrFunc::computeProperty1(int frame, StuntDouble* sd) {
    momenta_[frame].push_back(sd->getMass() * sd->getVel());
    return momenta_[frame].size() - 1;
  }